

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::FillExtensionToLanguageMap(cmGlobalGenerator *this,string *l,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  undefined8 uVar4;
  cmMakefile *this_00;
  long *plVar5;
  undefined8 *puVar6;
  string *psVar7;
  mapped_type *pmVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ulong uVar9;
  pointer pbVar10;
  string *i;
  key_type *pkVar11;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionList;
  string extensionsVar;
  undefined1 local_d8 [24];
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  pointer *local_98;
  long local_90;
  pointer local_88 [2];
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  cmMakefile *local_38;
  
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_","");
  pcVar3 = (l->_M_dataplus)._M_p;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,pcVar3,pcVar3 + l->_M_string_length)
  ;
  uVar9 = 0xf;
  if (local_58 != local_48) {
    uVar9 = local_48[0];
  }
  local_38 = mf;
  if (uVar9 < (ulong)(local_70 + local_50)) {
    uVar9 = 0xf;
    if (local_78 != local_68) {
      uVar9 = local_68[0];
    }
    if (uVar9 < (ulong)(local_70 + local_50)) goto LAB_00408430;
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_58);
  }
  else {
LAB_00408430:
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78);
  }
  local_d8._0_8_ = local_d8 + 0x10;
  pkVar11 = (key_type *)(plVar5 + 2);
  if ((key_type *)*plVar5 == pkVar11) {
    local_d8._16_8_ = (pkVar11->_M_dataplus)._M_p;
    uStack_c0 = (undefined4)plVar5[3];
    uStack_bc = *(undefined4 *)((long)plVar5 + 0x1c);
  }
  else {
    local_d8._16_8_ = (pkVar11->_M_dataplus)._M_p;
    local_d8._0_8_ = (key_type *)*plVar5;
  }
  local_d8._8_8_ = plVar5[1];
  *plVar5 = (long)pkVar11;
  plVar5[1] = 0;
  *(undefined1 *)&(pkVar11->_M_dataplus)._M_p = 0;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"_SOURCE_FILE_EXTENSIONS","");
  pbVar2 = (pointer)((long)&((_Alloc_hider *)local_d8._8_8_)->_M_p + local_90);
  pbVar10 = (pointer)0xf;
  if ((key_type *)local_d8._0_8_ != (key_type *)(local_d8 + 0x10)) {
    pbVar10 = (pointer)local_d8._16_8_;
  }
  if (pbVar10 < pbVar2) {
    pbVar10 = (pointer)0xf;
    if (local_98 != local_88) {
      pbVar10 = local_88[0];
    }
    if (pbVar2 <= pbVar10) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,local_d8._0_8_);
      goto LAB_0040850f;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append(local_d8,(ulong)local_98);
LAB_0040850f:
  local_b8._M_allocated_capacity = (size_type)&local_a8;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 == paVar1) {
    local_a8._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_a8._8_8_ = puVar6[3];
  }
  else {
    local_a8._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b8._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar6;
  }
  local_b8._8_8_ = puVar6[1];
  *puVar6 = paVar1;
  puVar6[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_98 != local_88) {
    operator_delete(local_98,(ulong)((long)&(local_88[0]->_M_dataplus)._M_p + 1));
  }
  this_00 = local_38;
  if ((key_type *)local_d8._0_8_ != (key_type *)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_d8._16_8_)->_M_p + 1));
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  psVar7 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_b8);
  arg._M_str = (psVar7->_M_dataplus)._M_p;
  arg._M_len = psVar7->_M_string_length;
  cmExpandedList_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d8,arg,false);
  uVar4 = local_d8._8_8_;
  if (local_d8._0_8_ != local_d8._8_8_) {
    pkVar11 = (key_type *)local_d8._0_8_;
    do {
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->ExtensionToLanguage,pkVar11);
      std::__cxx11::string::_M_assign((string *)pmVar8);
      pkVar11 = pkVar11 + 1;
    } while (pkVar11 != (key_type *)uVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_allocated_capacity != &local_a8) {
    operator_delete((void *)local_b8._M_allocated_capacity,local_a8._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::FillExtensionToLanguageMap(const std::string& l,
                                                   cmMakefile* mf)
{
  std::string extensionsVar = std::string("CMAKE_") + std::string(l) +
    std::string("_SOURCE_FILE_EXTENSIONS");
  const std::string& exts = mf->GetSafeDefinition(extensionsVar);
  std::vector<std::string> extensionList = cmExpandedList(exts);
  for (std::string const& i : extensionList) {
    this->ExtensionToLanguage[i] = l;
  }
}